

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O0

ion_bpp_err_t readDisk(ion_bpp_handle_t handle,ion_bpp_address_t adr,ion_bpp_buffer_t **b)

{
  ion_err_t iVar1;
  ion_bpp_err_t iVar2;
  ion_err_t err;
  ion_file_handle_t pFStack_40;
  ion_bpp_err_t rc;
  ion_bpp_buffer_t *buf;
  undefined8 *puStack_30;
  int len;
  ion_bpp_h_node_t *h;
  ion_bpp_buffer_t **b_local;
  ion_bpp_address_t adr_local;
  ion_bpp_handle_t handle_local;
  
  puStack_30 = (undefined8 *)handle;
  h = (ion_bpp_h_node_t *)b;
  b_local = (ion_bpp_buffer_t **)adr;
  adr_local = (ion_bpp_address_t)handle;
  handle_local._4_4_ = assignBuf(handle,adr,(ion_bpp_buffer_t **)&stack0xffffffffffffffc0);
  if (handle_local._4_4_ == bErrOk) {
    if (*(int *)&pFStack_40->_IO_write_base == 0) {
      buf._4_4_ = *(uint *)(puStack_30 + 2);
      if (b_local == (ion_bpp_buffer_t **)0x0) {
        buf._4_4_ = buf._4_4_ * 3;
      }
      iVar1 = ion_fread_at((ion_file_handle_t)*puStack_30,(ion_file_offset_t)b_local,buf._4_4_,
                           (ion_byte_t *)pFStack_40->_IO_read_base);
      if (iVar1 != '\0') {
        iVar2 = lineError(0x16e,bErrIO);
        return iVar2;
      }
      *(undefined4 *)((long)&pFStack_40->_IO_write_base + 4) = 0;
      *(undefined4 *)&pFStack_40->_IO_write_base = 1;
      nDiskReads = nDiskReads + 1;
      *(undefined4 *)((long)&pFStack_40->_IO_write_base + 4) = 0;
      *(undefined4 *)&pFStack_40->_IO_write_base = 1;
      nDiskReads = nDiskReads + 1;
    }
    h->fp = pFStack_40;
    handle_local._4_4_ = bErrOk;
  }
  return handle_local._4_4_;
}

Assistant:

static ion_bpp_err_t
readDisk(
	ion_bpp_handle_t	handle,
	ion_bpp_address_t	adr,
	ion_bpp_buffer_t	**b
) {
	ion_bpp_h_node_t *h = handle;
	/* read data into buf */
	int					len;
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */

	if ((rc = assignBuf(handle, adr, &buf)) != 0) {
		return rc;
	}

	if (!buf->valid) {
		len = h->sectorSize;

		if (adr == 0) {
			len *= 3;	/* root */
		}

		ion_err_t err = ion_fread_at(h->fp, adr, len, (ion_byte_t *) buf->p);

		if (err_ok != err) {
			return error(bErrIO);
		}

		buf->modified	= boolean_false;
		buf->valid		= boolean_true;
		nDiskReads++;

#if 0
		len = 1;

		if (adr == 0) {
			len = 3;/* root */
		}

		if (0 != fseek(h->fp, buf->adr, SEEK_SET)) {
			return error(bErrIO);
		}

		for (i = 0; i < len; i++) {
			if (1 != fread(&buf[i].p->leaf, sizeof(buf->p->leaf), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->ct, sizeof(buf->p->ct), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->prev, sizeof(buf->p->prev), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->next, sizeof(buf->p->next), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->childLT, sizeof(buf->p->childLT), 1, h->fp)) {
				return error(bErrIO);
			}

			if (1 != fread(&buf[i].p->fkey, sizeof(buf->p->fkey), 1, h->fp)) {
				return error(bErrIO);
			}
		}

#endif

		buf->modified	= boolean_false;
		buf->valid		= boolean_true;
		nDiskReads++;
	}

	*b = buf;
	return bErrOk;
}